

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Unsubtyping::noteSubtype(Unsubtyping *this,HeapType sub,HeapType super)

{
  bool bVar1;
  type *this_00;
  type_conflict1 *ptVar2;
  pointer ppVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>,_bool>
  pVar4;
  HeapType local_70;
  HeapType oldSuper;
  type_conflict1 *inserted;
  type *it;
  pair<const_wasm::HeapType,_wasm::HeapType> local_40;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>,_bool>
  local_30;
  Unsubtyping *local_20;
  Unsubtyping *this_local;
  HeapType super_local;
  HeapType sub_local;
  
  local_20 = this;
  this_local = (Unsubtyping *)super.id;
  super_local = sub;
  bVar1 = HeapType::operator==(&super_local,(HeapType *)&this_local);
  if (((!bVar1) && (bVar1 = HeapType::isBottom(&super_local), !bVar1)) &&
     (bVar1 = HeapType::isBottom((HeapType *)&this_local), !bVar1)) {
    std::pair<const_wasm::HeapType,_wasm::HeapType>::pair<wasm::HeapType_&,_wasm::HeapType_&,_true>
              (&local_40,&super_local,(HeapType *)&this_local);
    pVar4 = std::
            unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
            ::insert(&this->supertypes,&local_40);
    local_30.first =
         pVar4.first.
         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur;
    local_30.second = pVar4.second;
    this_00 = std::
              get<0ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,wasm::HeapType>,false,true>,bool>
                        (&local_30);
    ptVar2 = std::
             get<1ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,wasm::HeapType>,false,true>,bool>
                       (&local_30);
    if ((*ptVar2 & 1U) == 0) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
               operator->(this_00);
      local_70.id = (ppVar3->second).id;
      bVar1 = HeapType::operator==((HeapType *)&this_local,&local_70);
      if (!bVar1) {
        bVar1 = HeapType::isSubType((HeapType)this_local,local_70);
        if (bVar1) {
          ppVar3 = std::__detail::
                   _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
                   operator->(this_00);
          (ppVar3->second).id = (uintptr_t)this_local;
          UniqueDeferredQueue<wasm::HeapType>::push(&this->work,super_local);
          noteSubtype(this,(HeapType)this_local,local_70);
        }
        else {
          noteSubtype(this,local_70,(HeapType)this_local);
        }
      }
    }
    else {
      oldSuper = super_local;
      UniqueDeferredQueue<wasm::HeapType>::push(&this->work,super_local);
    }
  }
  return;
}

Assistant:

void noteSubtype(HeapType sub, HeapType super) {
    if (sub == super || sub.isBottom() || super.isBottom()) {
      return;
    }

    auto [it, inserted] = supertypes.insert({sub, super});
    if (inserted) {
      work.push(sub);
      // TODO: Incrementally check all subtypes (inclusive) of sub against super
      // and all its supertypes if we have already analyzed casts.
      return;
    }
    // We already had a recorded supertype. The new supertype might be deeper,
    // shallower, or identical to the old supertype.
    auto oldSuper = it->second;
    if (super == oldSuper) {
      return;
    }
    // There are two different supertypes, but each type can only have a single
    // direct subtype so the supertype chain cannot fork and one of the
    // supertypes must be a supertype of the other. Recursively record that
    // relationship as well.
    if (HeapType::isSubType(super, oldSuper)) {
      // sub <: super <: oldSuper
      it->second = super;
      work.push(sub);
      // TODO: Incrementally check all subtypes (inclusive) of sub against super
      // if we have already analyzed casts.
      noteSubtype(super, oldSuper);
    } else {
      // sub <: oldSuper <: super
      noteSubtype(oldSuper, super);
    }
  }